

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reader.hh
# Opt level: O2

uint64_t __thiscall avro::ReaderImpl<avro::Validator>::readVarInt(ReaderImpl<avro::Validator> *this)

{
  ulong in_RAX;
  ulong uVar1;
  byte bVar2;
  uint8_t val;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX & 0xffffffffffffff;
  bVar2 = 0;
  uVar1 = 0;
  do {
    BufferReader::read<unsigned_char>(&this->reader_,(uchar *)((long)&uStack_28 + 7));
    uVar1 = uVar1 | (ulong)(uStack_28._7_1_ & 0x7f) << (bVar2 & 0x3f);
    bVar2 = bVar2 + 7;
  } while ((long)uStack_28 < 0);
  return uVar1;
}

Assistant:

uint64_t readVarInt() {
        uint64_t encoded = 0;
        uint8_t val = 0;
        int shift = 0;
        do {
            reader_.read(val);
            uint64_t newbits = static_cast<uint64_t>(val & 0x7f) << shift;
            encoded |= newbits;
            shift += 7;
        } while (val & 0x80);

        return encoded;
    }